

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O3

void test_ecc_montgomery_multiply(void)

{
  MontgomeryCurve *wc;
  mp_int *x;
  size_t sVar1;
  MontgomeryPoint *src;
  size_t sVar2;
  MontgomeryPoint *pMVar3;
  
  wc = mcurve();
  x = mp_new(0x38);
  sVar1 = (*looplimit)(7);
  if (sVar1 == 0) {
    src = (MontgomeryPoint *)0x0;
  }
  else {
    sVar1 = 0;
    pMVar3 = (MontgomeryPoint *)0x0;
    do {
      src = mpoint(wc,sVar1);
      if (pMVar3 != (MontgomeryPoint *)0x0) {
        ecc_montgomery_point_copy_into(pMVar3,src);
        ecc_montgomery_point_free(src);
        src = pMVar3;
      }
      sVar2 = mp_max_bits(x);
      mp_random_bits_into(x,sVar2);
      test_index = test_index + 1;
      last_filename = dupprintf("%s/%s.%04zu",outdir,test_basename);
      (*log_to_file)(last_filename);
      pMVar3 = ecc_montgomery_multiply(src,x);
      (*log_to_file)((char *)0x0);
      safefree(last_filename);
      ecc_montgomery_point_free(pMVar3);
      sVar1 = sVar1 + 1;
      sVar2 = (*looplimit)(7);
      pMVar3 = src;
    } while (sVar1 < sVar2);
  }
  ecc_montgomery_point_free(src);
  ecc_montgomery_curve_free(wc);
  mp_free(x);
  return;
}

Assistant:

static void test_ecc_montgomery_multiply(void)
{
    MontgomeryCurve *wc = mcurve();
    MontgomeryPoint *a = NULL;
    mp_int *exponent = mp_new(56);
    for (size_t i = 0; i < looplimit(7); i++) {
        MontgomeryPoint *A = mpoint(wc, i);
        if (!a) {
            a = A;
        } else {
            ecc_montgomery_point_copy_into(a, A);
            ecc_montgomery_point_free(A);
        }
        mp_random_fill(exponent);

        log_start();
        MontgomeryPoint *r = ecc_montgomery_multiply(a, exponent);
        log_end();

        ecc_montgomery_point_free(r);
    }
    ecc_montgomery_point_free(a);
    ecc_montgomery_curve_free(wc);
    mp_free(exponent);
}